

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O1

void __thiscall
libDAI::JTree::GenerateJT
          (JTree *this,vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *Cliques)

{
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *pvVar1;
  pointer pDVar2;
  iterator iVar3;
  pointer pVVar4;
  pointer pVVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  mapped_type_conflict1 *pmVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pVVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  VarSet *ns;
  undefined4 extraout_var_06;
  mapped_type_conflict *pmVar11;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long lVar12;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  ostream *poVar13;
  pointer pVVar14;
  pointer pVVar15;
  size_t e;
  size_t I;
  long lVar16;
  size_t alpha;
  ulong uVar17;
  WeightedGraph<int> JuncGraph;
  long local_100;
  FRegion local_f8;
  pointer local_b8;
  ulong local_b0;
  long local_a8;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> *local_a0;
  TFactor<double> local_98;
  _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_int>,_std::_Select1st<std::pair<const_libDAI::UEdge,_int>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
  local_60;
  undefined4 extraout_var_10;
  
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  local_b0 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x28))
                       ((long *)CONCAT44(extraout_var,iVar7));
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0 = Cliques;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_a8 = 0x20;
    pVVar14 = (pointer)0x0;
    do {
      pVVar10 = (pointer)((long)&pVVar14->_label + 1);
      pVVar15 = (Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                _M_impl.super__Vector_impl_data._M_start;
      lVar16 = local_a8;
      local_b8 = pVVar10;
      if (pVVar10 < (pointer)((long)(Cliques->
                                    super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar15 >> 5
                             )) {
        do {
          VarSet::operator&((VarSet *)&local_f8,pVVar15 + (long)pVVar14,
                            (VarSet *)
                            ((long)&(pVVar15->_vars).
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar16));
          pVVar5 = local_f8.super_Factor._vs._vars.
                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pVVar4 = local_f8.super_Factor._vs._vars.
                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (local_f8.super_Factor._vs._vars.
              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f8.super_Factor._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_f8.super_Factor._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f8.super_Factor._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (pVVar5 != pVVar4) {
            local_f8.super_Factor._vs._vars.
            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start = pVVar14;
            local_f8.super_Factor._vs._vars.
            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_finish = pVVar10;
            pmVar9 = std::
                     map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
                     ::operator[]((map<libDAI::UEdge,_int,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
                                   *)&local_60,(key_type *)&local_f8);
            *pmVar9 = (int)local_b0 - (int)((ulong)((long)pVVar5 - (long)pVVar4) >> 4);
          }
          pVVar10 = (pointer)((long)&pVVar10->_label + 1);
          pVVar15 = (local_a0->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          Cliques = local_a0;
          lVar16 = lVar16 + 0x20;
        } while (pVVar10 < (pointer)((long)(local_a0->
                                           super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pVVar15 >> 5));
      }
      local_a8 = local_a8 + 0x20;
      pVVar14 = local_b8;
    } while (local_b8 <
             (pointer)((long)(Cliques->
                             super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(Cliques->
                             super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 5));
  }
  MinSpanningTreePrims<int>((DEdgeVec *)&local_f8,(WeightedGraph<int> *)&local_60);
  local_b8 = (pointer)&this->_RTree;
  std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::_M_move_assign
            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)local_b8,&local_f8);
  if (local_f8.super_Factor._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super_Factor._vs._vars.
                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super_Factor._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super_Factor._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::reserve
            ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)
             (CONCAT44(extraout_var_00,iVar7) + 0xe0),
             (long)(Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 5);
  if ((Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (Cliques->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_100 = 0;
    uVar17 = 0;
    do {
      local_b0 = uVar17;
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::TFactor
                (&local_98,
                 (VarSet *)
                 ((long)&(((Cliques->
                           super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                           _M_impl.super__Vector_impl_data._M_start)->_vars).
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + local_100),1.0);
      TFactor<double>::TFactor(&local_f8.super_Factor,&local_98);
      local_f8._c = 1.0;
      std::vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_>::emplace_back<libDAI::FRegion>
                ((vector<libDAI::FRegion,_std::allocator<libDAI::FRegion>_> *)
                 (CONCAT44(extraout_var_01,iVar7) + 0xe0),&local_f8);
      if (local_f8.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super_Factor._p._p.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super_Factor._p._p.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super_Factor._p._p.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_f8.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super_Factor._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super_Factor._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super_Factor._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar17 = local_b0;
      if (local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar17 = uVar17 + 1;
      local_100 = local_100 + 0x20;
    } while (uVar17 < (ulong)((long)(Cliques->
                                    super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(Cliques->
                                    super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pVVar14 = (pointer)0x0;
  do {
    iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    pVVar10 = (pointer)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar7) + 0x48))
                                 ((long *)CONCAT44(extraout_var_02,iVar7));
    if (pVVar10 <= pVVar14) {
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      RegionGraph::RecomputeORs((RegionGraph *)CONCAT44(extraout_var_07,iVar7));
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::reserve
                ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                 (CONCAT44(extraout_var_08,iVar7) + 0xf8),
                 (long)(this->_RTree).
                       super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->_RTree).
                       super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                       super__Vector_impl_data._M_start >> 4);
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)(CONCAT44(extraout_var_09,iVar7) + 0x110),
                (long)(this->_RTree).
                      super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->_RTree).
                      super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
      if ((this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar16 = 0;
        uVar17 = 0;
        do {
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          lVar12 = CONCAT44(extraout_var_10,iVar7);
          pDVar2 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          local_f8.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((*(long *)(CONCAT44(extraout_var_11,iVar7) + 0x100) -
                          *(long *)(CONCAT44(extraout_var_11,iVar7) + 0xf8) >> 3) *
                        -0x3333333333333333);
          local_f8.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)((long)&pDVar2->n1 + lVar16);
          iVar3._M_current = *(pair<unsigned_long,_unsigned_long> **)(lVar12 + 0x118);
          if (iVar3._M_current == *(pair<unsigned_long,_unsigned_long> **)(lVar12 + 0x120)) {
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                      ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                        *)(lVar12 + 0x110),iVar3,(pair<unsigned_long,_unsigned_long> *)&local_f8);
          }
          else {
            (iVar3._M_current)->first =
                 (unsigned_long)
                 local_f8.super_Factor._vs._vars.
                 super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (iVar3._M_current)->second =
                 (unsigned_long)
                 local_f8.super_Factor._vs._vars.
                 super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            *(long *)(lVar12 + 0x118) = *(long *)(lVar12 + 0x118) + 0x10;
          }
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          lVar12 = CONCAT44(extraout_var_12,iVar7);
          pDVar2 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          local_f8.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((*(long *)(CONCAT44(extraout_var_13,iVar7) + 0x100) -
                          *(long *)(CONCAT44(extraout_var_13,iVar7) + 0xf8) >> 3) *
                        -0x3333333333333333);
          local_f8.super_Factor._vs._vars.
          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)((long)&pDVar2->n2 + lVar16);
          iVar3._M_current = *(pair<unsigned_long,_unsigned_long> **)(lVar12 + 0x118);
          if (iVar3._M_current == *(pair<unsigned_long,_unsigned_long> **)(lVar12 + 0x120)) {
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                      ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                        *)(lVar12 + 0x110),iVar3,(pair<unsigned_long,_unsigned_long> *)&local_f8);
          }
          else {
            (iVar3._M_current)->first =
                 (unsigned_long)
                 local_f8.super_Factor._vs._vars.
                 super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (iVar3._M_current)->second =
                 (unsigned_long)
                 local_f8.super_Factor._vs._vars.
                 super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            *(long *)(lVar12 + 0x118) = *(long *)(lVar12 + 0x118) + 0x10;
          }
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          pDVar2 = (((_Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                    &local_b8->_label)->_M_impl).super__Vector_impl_data._M_start;
          pVVar15 = (local_a0->super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          VarSet::operator&(&local_98._vs,pVVar15 + *(long *)((long)&pDVar2->n1 + lVar16),
                            pVVar15 + *(long *)((long)&pDVar2->n2 + lVar16));
          std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
                    ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_f8,
                     (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_98);
          local_f8.super_Factor._vs._statespace = local_98._vs._statespace;
          local_f8.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
          std::vector<libDAI::Region,_std::allocator<libDAI::Region>_>::emplace_back<libDAI::Region>
                    ((vector<libDAI::Region,_std::allocator<libDAI::Region>_> *)
                     (CONCAT44(extraout_var_14,iVar7) + 0xf8),(Region *)&local_f8);
          if (local_f8.super_Factor._vs._vars.
              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f8.super_Factor._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_f8.super_Factor._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f8.super_Factor._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_98._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar17 = uVar17 + 1;
          lVar16 = lVar16 + 0x10;
        } while (uVar17 < (ulong)((long)(this->_RTree).
                                        super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->_RTree).
                                        super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      BipartiteGraph<libDAI::FRegion,_libDAI::Region>::Regenerate
                ((BipartiteGraph<libDAI::FRegion,_libDAI::Region> *)
                 (CONCAT44(extraout_var_15,iVar7) + 0xe0));
      pvVar1 = &this->_Qa;
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
      _M_erase_at_end(pvVar1,(this->_Qa).
                             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
                (pvVar1,*(long *)(CONCAT44(extraout_var_16,iVar7) + 0xe8) -
                        *(long *)(CONCAT44(extraout_var_16,iVar7) + 0xe0) >> 6);
      lVar16 = 0;
      for (uVar17 = 0;
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this),
          uVar17 < (ulong)(*(long *)(CONCAT44(extraout_var_17,iVar7) + 0xe8) -
                           *(long *)(CONCAT44(extraout_var_17,iVar7) + 0xe0) >> 6);
          uVar17 = uVar17 + 1) {
        iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
                  (pvVar1,(value_type *)(*(long *)(CONCAT44(extraout_var_18,iVar7) + 0xe0) + lVar16)
                  );
        lVar16 = lVar16 + 0x40;
      }
      pvVar1 = &this->_Qb;
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
      _M_erase_at_end(pvVar1,(this->_Qb).
                             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
                (pvVar1,(*(long *)(CONCAT44(extraout_var_19,iVar7) + 0x100) -
                         *(long *)(CONCAT44(extraout_var_19,iVar7) + 0xf8) >> 3) *
                        -0x3333333333333333);
      lVar16 = 0;
      for (uVar17 = 0;
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this),
          uVar17 < (ulong)((*(long *)(CONCAT44(extraout_var_20,iVar7) + 0x100) -
                            *(long *)(CONCAT44(extraout_var_20,iVar7) + 0xf8) >> 3) *
                          -0x3333333333333333); uVar17 = uVar17 + 1) {
        iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        TFactor<double>::TFactor
                  (&local_f8.super_Factor,
                   (VarSet *)(*(long *)(CONCAT44(extraout_var_21,iVar7) + 0xf8) + lVar16),1.0);
        std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
        emplace_back<libDAI::TFactor<double>>
                  ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)pvVar1
                   ,&local_f8.super_Factor);
        if (local_f8.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.super_Factor._p._p.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f8.super_Factor._p._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.super_Factor._p._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_f8.super_Factor._vs._vars.
            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.super_Factor._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f8.super_Factor._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.super_Factor._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        lVar16 = lVar16 + 0x28;
      }
      pvVar1 = &this->_mes;
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::
      _M_erase_at_end(pvVar1,(this->_mes).
                             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
                (pvVar1,*(long *)(CONCAT44(extraout_var_22,iVar7) + 0x118) -
                        *(long *)(CONCAT44(extraout_var_22,iVar7) + 0x110) >> 4);
      lVar16 = 8;
      for (uVar17 = 0;
          iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this),
          uVar17 < (ulong)(*(long *)(CONCAT44(extraout_var_23,iVar7) + 0x118) -
                           *(long *)(CONCAT44(extraout_var_23,iVar7) + 0x110) >> 4);
          uVar17 = uVar17 + 1) {
        iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        iVar8 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        TFactor<double>::TFactor
                  (&local_f8.super_Factor,
                   (VarSet *)
                   (*(long *)(*(long *)(CONCAT44(extraout_var_25,iVar8) + 0x110) + lVar16) * 0x28 +
                   *(long *)(CONCAT44(extraout_var_24,iVar7) + 0xf8)),1.0);
        std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
        emplace_back<libDAI::TFactor<double>>
                  ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)pvVar1
                   ,&local_f8.super_Factor);
        if (local_f8.super_Factor._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.super_Factor._p._p.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f8.super_Factor._p._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.super_Factor._p._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_f8.super_Factor._vs._vars.
            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.super_Factor._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f8.super_Factor._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.super_Factor._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        lVar16 = lVar16 + 0x10;
      }
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      RegionGraph::Check_Counting_Numbers((RegionGraph *)CONCAT44(extraout_var_26,iVar7));
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
      if (2 < CONCAT44(extraout_var_27,iVar7)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Resulting regiongraph: ",0x17);
        iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        poVar13 = libDAI::operator<<((ostream *)&std::cout,
                                     (RegionGraph *)CONCAT44(extraout_var_28,iVar7));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
      }
      std::
      _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_int>,_std::_Select1st<std::pair<const_libDAI::UEdge,_int>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_int>_>_>
      ::~_Rb_tree(&local_60);
      return;
    }
    lVar16 = 0;
    for (uVar17 = 0;
        iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        , uVar17 < (ulong)(*(long *)(CONCAT44(extraout_var_03,iVar7) + 0xe8) -
                           *(long *)(CONCAT44(extraout_var_03,iVar7) + 0xe0) >> 6);
        uVar17 = uVar17 + 1) {
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar12 = *(long *)(CONCAT44(extraout_var_04,iVar7) + 0xe0);
      iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      ns = (VarSet *)
           (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0x50))
                     ((long *)CONCAT44(extraout_var_05,iVar7),pVVar14);
      bVar6 = VarSet::includes((VarSet *)(lVar12 + lVar16),ns);
      if (bVar6) {
        iVar7 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        local_f8.super_Factor._vs._vars.
        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = pVVar14;
        pmVar11 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)(CONCAT44(extraout_var_06,iVar7) + 0x170),(key_type *)&local_f8);
        *pmVar11 = uVar17;
        break;
      }
      lVar16 = lVar16 + 0x40;
    }
    pVVar14 = (pointer)((long)&pVVar14->_label + 1);
  } while( true );
}

Assistant:

void JTree::GenerateJT( const std::vector<VarSet> &Cliques ) {
        // Construct a weighted graph (each edge is weighted with the cardinality 
        // of the intersection of the nodes, where the nodes are the elements of
        // Cliques).
        size_t N = grm().nrVars();
        WeightedGraph<int> JuncGraph;
        for( size_t i = 0; i < Cliques.size(); i++ )
            for( size_t j = i+1; j < Cliques.size(); j++ ) {
                size_t w = (Cliques[i] & Cliques[j]).size();
                if( w ) 
                    JuncGraph[UEdge(i,j)] = N - w;
            }
        
        // Construct minimal spanning tree using Prim's algorithm
        _RTree = MinSpanningTreePrims( JuncGraph);

        // Construct corresponding region graph

        // Create outer regions
        grm().ORs().reserve( Cliques.size() );
        for( size_t i = 0; i < Cliques.size(); i++ )
            grm().ORs().push_back( FRegion( Factor(Cliques[i], 1.0), 1.0 ) );

        // For each factor, find an outer region that subsumes that factor.
        // Then, multiply the outer region with that factor.
        for( size_t I = 0; I < grm().nrFactors(); I++ ) {
            size_t alpha;
            for( alpha = 0; alpha < grm().nr_ORs(); alpha++ )
                if( grm().OR(alpha).vars() >> grm().factor(I).vars() ) {
    //              grm().OR(alpha) *= grm().factor(I);
                    grm().setFac2OR(I, alpha);
                    break;
                }
            assert( alpha != grm().nr_ORs() );
        }
        grm().RecomputeORs();

        // Create inner regions and edges
        grm().IRs().reserve( _RTree.size() );
        grm().Redges().reserve( 2 * _RTree.size() );
        for( size_t i = 0; i < _RTree.size(); i++ ) {
            grm().Redges().push_back( RegionGraph::R_edge_t( _RTree[i].n1, grm().IRs().size() ) );
            grm().Redges().push_back( RegionGraph::R_edge_t( _RTree[i].n2, grm().IRs().size() ) );
            // inner clusters have counting number -1
            grm().IRs().push_back( Region( Cliques[_RTree[i].n1] & Cliques[_RTree[i].n2], -1.0 ) );
        }

        // Regenerate BipartiteGraph internals
        grm().Regenerate();

        // Create messages and beliefs
        _Qa.clear();
        _Qa.reserve( grm().nr_ORs() );
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa.push_back( grm().OR(alpha) );

        _Qb.clear();
        _Qb.reserve( grm().nr_IRs() );
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) 
            _Qb.push_back( Factor( grm().IR(beta), 1.0 ) );

        _mes.clear();
        _mes.reserve( grm().nr_Redges() );
        for( size_t e = 0; e < grm().nr_Redges(); e++ )
            _mes.push_back( Factor( grm().IR(grm().Redge(e).second), 1.0 ) );

        // Check counting numbers
        grm().Check_Counting_Numbers();

        if( Verbose() >= 3 ) {
            cout << "Resulting regiongraph: " << grm() << endl;
        }
    }